

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void __thiscall btLCP::transfer_i_to_C(btLCP *this,int i)

{
  float fVar1;
  int iVar2;
  btScalar *pbVar3;
  btScalar *a;
  int j;
  long lVar4;
  btScalar **A;
  int nC;
  int iVar5;
  long lVar6;
  btScalar bVar7;
  int in_stack_ffffffffffffffd0;
  
  iVar5 = this->m_nC;
  lVar6 = (long)iVar5;
  if (lVar6 < 1) {
    A = this->m_A;
    *this->m_d = 1.0 / A[i][i];
  }
  else {
    iVar2 = this->m_nskip;
    pbVar3 = this->m_L;
    a = this->m_ell;
    for (lVar4 = 0; lVar6 != lVar4; lVar4 = lVar4 + 1) {
      pbVar3[iVar2 * iVar5 + lVar4] = a[lVar4];
    }
    fVar1 = this->m_A[i][i];
    in_stack_ffffffffffffffd0 = 0x194b95;
    bVar7 = btLargeDot(a,this->m_Dell,iVar5);
    this->m_d[lVar6] = 1.0 / (fVar1 - bVar7);
    A = this->m_A;
    iVar5 = this->m_nC;
  }
  btSwapProblem(A,this->m_x,this->m_b,this->m_w,this->m_lo,this->m_hi,this->m_p,this->m_state,
                this->m_findex,this->m_n,iVar5,i,1,in_stack_ffffffffffffffd0);
  iVar5 = this->m_nC;
  this->m_C[iVar5] = iVar5;
  this->m_nC = iVar5 + 1;
  return;
}

Assistant:

void btLCP::transfer_i_to_C (int i)
{
  {
    if (m_nC > 0) {
      // ell,Dell were computed by solve1(). note, ell = D \ L1solve (L,A(i,C))
      {
        const int nC = m_nC;
        btScalar *const Ltgt = m_L + nC*m_nskip, *ell = m_ell;
        for (int j=0; j<nC; ++j) Ltgt[j] = ell[j];
      }
      const int nC = m_nC;
      m_d[nC] = btRecip (BTAROW(i)[i] - btLargeDot(m_ell,m_Dell,nC));
    }
    else {
      m_d[0] = btRecip (BTAROW(i)[i]);
    }

    btSwapProblem (m_A,m_x,m_b,m_w,m_lo,m_hi,m_p,m_state,m_findex,m_n,m_nC,i,m_nskip,1);

    const int nC = m_nC;
    m_C[nC] = nC;
    m_nC = nC + 1; // nC value is outdated after this line
  }

}